

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O0

void IOcontroller::
     save_file<std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>>
               (string *filename,
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               *output)

{
  byte bVar1;
  reference pvVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [8];
  StreamType res;
  char local_218 [8];
  ofstream outfile;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *output_local;
  string *filename_local;
  
  std::ofstream::ofstream(local_218,(string *)filename,_S_bin);
  bVar1 = std::ios::eof();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      serialize<std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>>
                (output,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      std::ostream::write(local_218,(long)pvVar2);
      std::ofstream::close();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      poVar3 = std::operator<<((ostream *)&std::cout,"Save file successfully: ");
      poVar3 = std::operator<<(poVar3,(string *)filename);
      std::operator<<(poVar3,'\n');
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_240);
      std::ofstream::~ofstream(local_218);
      return;
    }
  }
  std::operator+(&local_260,"Save file failed: ",filename);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_260);
  std::operator<<(poVar3,'\n');
  std::__cxx11::string::~string((string *)&local_260);
  exit(1);
}

Assistant:

static void save_file(const std::string filename, const T& output)
    {
        std::ofstream outfile(filename, std::ios::binary);
        if (!outfile.eof() && !outfile.fail())
        {
            StreamType res;
            serialize(output, res);
            outfile.write(reinterpret_cast<char*>(&res[0]), res.size());
            outfile.close();
            res.clear();
            std::cout << "Save file successfully: " << filename << '\n';
        }
        else
        {
            std::cout << "Save file failed: " + filename << '\n';
            exit(1);
        }
    }